

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Flatten.cpp
# Opt level: O3

unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> __thiscall
wasm::Flatten::create(Flatten *this)

{
  _func_int **__s;
  
  __s = (_func_int **)operator_new(0x210);
  memset(__s,0,0x200);
  __s[2] = (_func_int *)(__s + 4);
  __s[0xb] = (_func_int *)0x0;
  __s[0xc] = (_func_int *)0x0;
  __s[0x31] = (_func_int *)0x0;
  __s[0x32] = (_func_int *)0x0;
  __s[0x33] = (_func_int *)0x0;
  __s[0x21] = (_func_int *)0x0;
  __s[0x22] = (_func_int *)0x0;
  __s[0x23] = (_func_int *)0x0;
  __s[0x24] = (_func_int *)0x0;
  __s[0x25] = (_func_int *)0x0;
  __s[0x26] = (_func_int *)0x0;
  *__s = (_func_int *)&PTR__Flatten_010724d0;
  __s[0x34] = (_func_int *)(__s + 0x3a);
  __s[0x35] = (_func_int *)0x1;
  __s[0x36] = (_func_int *)0x0;
  __s[0x37] = (_func_int *)0x0;
  *(undefined4 *)(__s + 0x38) = 0x3f800000;
  __s[0x39] = (_func_int *)0x0;
  __s[0x3a] = (_func_int *)0x0;
  __s[0x3b] = (_func_int *)(__s + 0x41);
  __s[0x3c] = (_func_int *)0x1;
  __s[0x3d] = (_func_int *)0x0;
  __s[0x3e] = (_func_int *)0x0;
  *(undefined4 *)(__s + 0x3f) = 0x3f800000;
  __s[0x40] = (_func_int *)0x0;
  __s[0x41] = (_func_int *)0x0;
  (this->
  super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
  ).super_Pass._vptr_Pass = __s;
  return (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)
         (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Pass> create() override {
    return std::make_unique<Flatten>();
  }